

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::Section::~Section(Section *this)

{
  double dVar1;
  byte bVar2;
  SectionEndInfo endInfo;
  SectionInfo local_a0;
  size_t local_30;
  size_t sStack_28;
  size_t local_20;
  double local_18;
  
  (this->super_NonCopyable)._vptr_NonCopyable = (_func_int **)&PTR__Section_00167ef8;
  if (this->m_sectionIncluded == true) {
    dVar1 = Timer::getElapsedSeconds(&this->m_timer);
    SectionInfo::SectionInfo(&local_a0,&this->m_info);
    local_20 = (this->m_assertions).failedButOk;
    local_30 = (this->m_assertions).passed;
    sStack_28 = (this->m_assertions).failed;
    local_18 = dVar1;
    bVar2 = std::uncaught_exception();
    (*this->m_runContext->_vptr_IRunContext[(ulong)bVar2 + 4])(this->m_runContext,&local_a0);
    SectionInfo::~SectionInfo(&local_a0);
  }
  std::__cxx11::string::~string((string *)&this->m_name);
  SectionInfo::~SectionInfo(&this->m_info);
  return;
}

Assistant:

Section::~Section() {
        if( m_sectionIncluded ) {
            SectionEndInfo endInfo( m_info, m_assertions, m_timer.getElapsedSeconds() );
            if( std::uncaught_exception() )
                m_runContext.sectionEndedEarly( endInfo );
            else
                m_runContext.sectionEnded( endInfo );
        }
    }